

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ExprAnd(Fts5Expr **pp1,Fts5Expr *p2)

{
  uint uVar1;
  Fts5Expr *pFVar2;
  Fts5ExprPhrase **pOld;
  int iVar3;
  Fts5ExprNode *pFVar4;
  Fts5ExprPhrase **__src;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  Fts5Parse sParse;
  Fts5Parse local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.pConfig = (Fts5Config *)0x0;
  local_68.zErr = (char *)0x0;
  local_68.rc = 0;
  local_68.nPhrase = 0;
  local_68.apPhrase = (Fts5ExprPhrase **)0x0;
  local_68.pExpr = (Fts5ExprNode *)0x0;
  local_68.bPhraseToAnd = 0;
  local_68._44_4_ = 0;
  pFVar2 = *pp1;
  if (p2 == (Fts5Expr *)0x0 || pFVar2 == (Fts5Expr *)0x0) {
    if (p2 != (Fts5Expr *)0x0) {
      *pp1 = p2;
    }
  }
  else {
    iVar6 = p2->nPhrase + pFVar2->nPhrase;
    pFVar4 = sqlite3Fts5ParseNode(&local_68,2,pFVar2->pRoot,p2->pRoot,(Fts5ExprNearset *)0x0);
    pFVar2->pRoot = pFVar4;
    p2->pRoot = (Fts5ExprNode *)0x0;
    if (local_68.rc == 0) {
      pOld = pFVar2->apExprPhrase;
      iVar3 = sqlite3_initialize();
      __src = (Fts5ExprPhrase **)0x0;
      if (iVar3 == 0) {
        uVar1 = iVar6 * 8;
        if (0 < (int)uVar1) {
          __src = (Fts5ExprPhrase **)(ulong)uVar1;
        }
        __src = (Fts5ExprPhrase **)sqlite3Realloc(pOld,(u64)__src);
      }
      if (__src == (Fts5ExprPhrase **)0x0) {
        local_68.rc = 7;
      }
      else {
        memmove(__src + p2->nPhrase,__src,(long)pFVar2->nPhrase << 3);
        iVar3 = p2->nPhrase;
        if (0 < (long)iVar3) {
          lVar5 = 0;
          do {
            __src[lVar5] = p2->apExprPhrase[lVar5];
            lVar5 = lVar5 + 1;
          } while (iVar3 != lVar5);
        }
        pFVar2->nPhrase = iVar6;
        pFVar2->apExprPhrase = __src;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return local_68.rc;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5ExprAnd(Fts5Expr **pp1, Fts5Expr *p2){
  Fts5Parse sParse;
  memset(&sParse, 0, sizeof(sParse));

  if( *pp1 && p2 ){
    Fts5Expr *p1 = *pp1;
    int nPhrase = p1->nPhrase + p2->nPhrase;

    p1->pRoot = sqlite3Fts5ParseNode(&sParse, FTS5_AND, p1->pRoot, p2->pRoot,0);
    p2->pRoot = 0;

    if( sParse.rc==SQLITE_OK ){
      Fts5ExprPhrase **ap = (Fts5ExprPhrase**)sqlite3_realloc(
          p1->apExprPhrase, nPhrase * sizeof(Fts5ExprPhrase*)
      );
      if( ap==0 ){
        sParse.rc = SQLITE_NOMEM;
      }else{
        int i;
        memmove(&ap[p2->nPhrase], ap, p1->nPhrase*sizeof(Fts5ExprPhrase*));
        for(i=0; i<p2->nPhrase; i++){
          ap[i] = p2->apExprPhrase[i];
        }
        p1->nPhrase = nPhrase;
        p1->apExprPhrase = ap;
      }
    }
    sqlite3_free(p2->apExprPhrase);
    sqlite3_free(p2);
  }else if( p2 ){
    *pp1 = p2;
  }

  return sParse.rc;
}